

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

InputPartData * __thiscall Imf_3_4::MultiPartInputFile::getPart(MultiPartInputFile *this,int n)

{
  element_type *peVar1;
  pointer pPVar2;
  ostream *poVar3;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  if ((-1 < n) &&
     (peVar1 = (this->_data).
               super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,
     pPVar2 = (peVar1->parts).
              super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
              ._M_impl.super__Vector_impl_data._M_start,
     (ulong)(uint)n <
     (ulong)(((long)(peVar1->parts).
                    super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x60))) {
    return &pPVar2[(uint)n].data;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar3 = std::operator<<(local_190,"MultiPartInputFile::getPart called with invalid part ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,n);
  poVar3 = std::operator<<(poVar3," on file with ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," parts");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

InputPartData*
MultiPartInputFile::getPart (int n) const
{
    if (n < 0 || static_cast<size_t> (n) >= _data->parts.size ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "MultiPartInputFile::getPart called with invalid part "
                << n << " on file with " << _data->parts.size () << " parts");
    }
    return &(_data->parts[n].data);
}